

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.c
# Opt level: O1

void var_ht_put(VarHashTable *ht,VarHTItemKey key,Variable value)

{
  uint32_t uVar1;
  size_t sVar2;
  var_table_item_t *__ptr;
  uint32_t uVar3;
  int iVar4;
  var_table_item_t *pvVar5;
  uint64_t uVar6;
  size_t length;
  char *string;
  VarHTItem *pVVar7;
  var_table_item_t **ppvVar8;
  var_table_item_t *pvVar9;
  ulong uVar10;
  VarHashTable local_48;
  undefined8 local_38;
  
  local_38 = value._8_8_;
  length = key.ident_length;
  string = key.key_ident_string;
  uVar3 = hash_string(string,length);
  uVar1 = ht->cap;
  pvVar5 = (var_table_item_t *)malloc(0x28);
  pvVar5->next = (var_table_item_t *)0x0;
  (pvVar5->key).key_ident_string = string;
  (pvVar5->key).ident_length = length;
  (pvVar5->value).index = (int)value._0_8_;
  (pvVar5->value).scope = (int)((ulong)value._0_8_ >> 0x20);
  (pvVar5->value).frame_offset = (undefined4)local_38;
  (pvVar5->value).assignable = (_Bool)local_38._4_1_;
  *(undefined3 *)&(pvVar5->value).field_0xd = local_38._5_3_;
  ppvVar8 = ht->buckets + (uVar1 - 1 & uVar3);
  pVVar7 = *ppvVar8;
  if (pVVar7 != (VarHTItem *)0x0) {
    sVar2 = (pVVar7->key).ident_length;
    if ((sVar2 == length) && (iVar4 = bcmp((pVVar7->key).key_ident_string,string,sVar2), iVar4 == 0)
       ) {
      pvVar9 = pVVar7->next;
      free(pVVar7);
      *ppvVar8 = pvVar5;
LAB_001082b4:
      pvVar5->next = pvVar9;
      goto LAB_001082b8;
    }
    while( true ) {
      __ptr = pVVar7->next;
      ppvVar8 = &pVVar7->next;
      if (__ptr == (var_table_item_t *)0x0) break;
      sVar2 = (__ptr->key).ident_length;
      if ((sVar2 == length) &&
         (iVar4 = bcmp((__ptr->key).key_ident_string,string,sVar2), iVar4 == 0)) {
        pvVar9 = __ptr->next;
        free(__ptr);
        *ppvVar8 = pvVar5;
        goto LAB_001082b4;
      }
      pVVar7 = *ppvVar8;
    }
  }
  *ppvVar8 = pvVar5;
  ht->size = ht->size + 1;
LAB_001082b8:
  if (ht->cap < ht->size) {
    uVar6 = next_pow_of_2((ulong)(ht->cap + 1));
    uVar6 = next_pow_of_2(uVar6 & 0xffffffff);
    local_48.cap = (uint32_t)uVar6;
    local_48.size = 0;
    local_48.buckets = (VarHTItem **)0x0;
    local_48.buckets = (VarHTItem **)calloc(uVar6 & 0xffffffff,8);
    if (ht->cap != 0) {
      uVar10 = 0;
      do {
        for (pVVar7 = ht->buckets[uVar10]; pVVar7 != (VarHTItem *)0x0; pVVar7 = pVVar7->next) {
          var_ht_put(&local_48,pVVar7->key,pVVar7->value);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < ht->cap);
    }
    var_ht_free(ht);
    ht->cap = local_48.cap;
    ht->size = local_48.size;
    ht->buckets = local_48.buckets;
  }
  return;
}

Assistant:

void var_ht_put(VarHashTable *ht, VarHTItemKey key, Variable value) {
    uint32_t index = var_hash(key) & (ht->cap - 1);
    VarHTItem *new_item = malloc(sizeof(VarHTItem));
    new_item->next = NULL;
    new_item->key = key;
    new_item->value = value;

    bool already_inside = false;
    if (ht->buckets[index] == NULL) {
        ht->buckets[index] = new_item;
    } else {
        already_inside = insert(&ht->buckets[index], key, new_item);
    }

    if (!already_inside) {
        ++ht->size;
    }

    if (ht->size > ht->cap) {
        resize(ht);
    }
}